

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# api.c
# Opt level: O2

int yaml_alias_event_initialize(yaml_event_t *event,yaml_char_t *anchor)

{
  int iVar1;
  size_t length;
  yaml_char_t *pyVar2;
  int iVar3;
  
  if (event == (yaml_event_t *)0x0) {
    __assert_fail("event",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                  ,0x322,"int yaml_alias_event_initialize(yaml_event_t *, yaml_char_t *)");
  }
  if (anchor != (yaml_char_t *)0x0) {
    length = strlen((char *)anchor);
    iVar1 = yaml_check_utf8(anchor,length);
    iVar3 = 0;
    if (iVar1 != 0) {
      pyVar2 = (yaml_char_t *)strdup((char *)anchor);
      if (pyVar2 != (yaml_char_t *)0x0) {
        *(undefined8 *)event = 0;
        (event->data).document_start.version_directive = (yaml_version_directive_t *)0x0;
        *(undefined8 *)((long)&event->data + 0x28) = 0;
        (event->data).scalar.length = 0;
        *(undefined8 *)((long)&event->data + 0x20) = 0;
        (event->data).document_start.tag_directives.start = (yaml_tag_directive_t *)0x0;
        (event->data).document_start.tag_directives.end = (yaml_tag_directive_t *)0x0;
        event->type = YAML_ALIAS_EVENT;
        (event->start_mark).index = 0;
        (event->start_mark).line = 0;
        (event->start_mark).column = 0;
        (event->end_mark).index = 0;
        (event->end_mark).line = 0;
        (event->end_mark).column = 0;
        (event->data).scalar.anchor = pyVar2;
        iVar3 = 1;
      }
    }
    return iVar3;
  }
  __assert_fail("anchor",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dyna-dot[P]libyaml/src/api.c"
                ,0x323,"int yaml_alias_event_initialize(yaml_event_t *, yaml_char_t *)");
}

Assistant:

YAML_DECLARE(int)
yaml_alias_event_initialize(yaml_event_t *event, yaml_char_t *anchor)
{
    yaml_mark_t mark = { 0, 0, 0 };
    yaml_char_t *anchor_copy = NULL;

    assert(event);      /* Non-NULL event object is expected. */
    assert(anchor);     /* Non-NULL anchor is expected. */

    if (!yaml_check_utf8(anchor, strlen((char *)anchor))) return 0;

    anchor_copy = yaml_strdup(anchor);
    if (!anchor_copy)
        return 0;

    ALIAS_EVENT_INIT(*event, anchor_copy, mark, mark);

    return 1;
}